

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O1

uint lodepng::convertToXYZ(float *out,float *whitepoint,uchar *in,uint w,uint h,LodePNGState *state)

{
  uint uVar1;
  uint uVar2;
  uchar *out_00;
  float *out_01;
  long lVar3;
  size_t n;
  uint uVar4;
  LodePNGInfo *info;
  size_t __size;
  float *pfVar5;
  float *pfVar6;
  LodePNGICC icc;
  LodePNGColorMode tempmode;
  uint local_1b0;
  LodePNGICC local_180;
  LodePNGColorMode local_58;
  
  uVar1 = (state->info_raw).bitdepth;
  n = 0x100;
  if (8 < uVar1) {
    n = 0x10000;
  }
  lodepng_color_mode_make(LCT_RGBA,(uint)(8 < uVar1) * 8 + 8);
  local_180.trc[0].lut = (float *)0x0;
  local_180.trc[0].lut_size = 0;
  local_180.trc[1].lut = (float *)0x0;
  local_180.trc[1].lut_size = 0;
  local_180.trc[2].lut = (float *)0x0;
  local_180.trc[2].lut_size = 0;
  if ((state->info_png).iccp_defined == 0) {
    local_1b0 = 0;
LAB_0011c2ed:
    uVar4 = h * w;
    out_00 = (uchar *)malloc((ulong)(uVar4 << (8 < uVar1 | 2U)));
    uVar2 = lodepng_convert(out_00,in,&local_58,&state->info_raw,w,h);
    if (uVar2 == 0) {
      info = &state->info_png;
      if ((local_1b0 == 0) || (local_180.inputspace != 2)) {
        out_01 = (float *)malloc((ulong)(uint)((int)n * 4));
        convertToXYZ_gamma_table(out_01,n,0,info,local_1b0,&local_180);
        pfVar5 = out_01;
        pfVar6 = out_01;
      }
      else {
        __size = 0xc00;
        if (8 < uVar1) {
          __size = 0xc0000;
        }
        out_01 = (float *)malloc(__size);
        convertToXYZ_gamma_table(out_01,n,0,info,local_1b0,&local_180);
        convertToXYZ_gamma_table(out_01 + n,n,1,info,local_1b0,&local_180);
        convertToXYZ_gamma_table(out_01 + n * 2,n,2,info,local_1b0,&local_180);
        pfVar5 = out_01 + n;
        pfVar6 = out_01 + n * 2;
      }
      if (uVar1 < 9) {
        if (uVar4 != 0) {
          lVar3 = 0;
          do {
            out[lVar3] = out_01[out_00[lVar3]];
            out[lVar3 + 1] = pfVar5[out_00[lVar3 + 1]];
            out[lVar3 + 2] = pfVar6[out_00[lVar3 + 2]];
            out[lVar3 + 3] = (float)out_00[lVar3 + 3] * 0.003921569;
            lVar3 = lVar3 + 4;
          } while ((ulong)uVar4 << 2 != lVar3);
        }
      }
      else if (uVar4 != 0) {
        lVar3 = 0;
        do {
          *(float *)((long)out + lVar3 * 2) =
               out_01[(ushort)(*(ushort *)(out_00 + lVar3) << 8 | *(ushort *)(out_00 + lVar3) >> 8)]
          ;
          *(float *)((long)out + lVar3 * 2 + 4) =
               pfVar5[(ushort)(*(ushort *)(out_00 + lVar3 + 2) << 8 |
                              *(ushort *)(out_00 + lVar3 + 2) >> 8)];
          *(float *)((long)out + lVar3 * 2 + 8) =
               pfVar6[(ushort)(*(ushort *)(out_00 + lVar3 + 4) << 8 |
                              *(ushort *)(out_00 + lVar3 + 4) >> 8)];
          *(float *)((long)out + lVar3 * 2 + 0xc) =
               (float)(ushort)(*(ushort *)(out_00 + lVar3 + 6) << 8 |
                              *(ushort *)(out_00 + lVar3 + 6) >> 8) * 1.5259022e-05;
          lVar3 = lVar3 + 8;
        } while ((ulong)uVar4 << 3 != lVar3);
      }
      convertToXYZ_chrm(out,w,h,info,local_1b0,&local_180,whitepoint);
      uVar2 = 0;
      goto LAB_0011c5b2;
    }
  }
  else {
    uVar2 = parseICC(&local_180,(state->info_png).iccp_profile,
                     (ulong)(state->info_png).iccp_profile_size);
    if (uVar2 == 0) {
      local_1b0 = local_180.inputspace;
      if (local_180.inputspace != 0) {
        if (local_180.inputspace == 2) {
          local_1b0 = 0;
          if ((local_180.has_chromaticity != 0) && (local_180.has_whitepoint != 0)) {
LAB_0011c60e:
            local_1b0 = (uint)(local_180.has_trc != 0);
          }
        }
        else {
          if (local_180.has_whitepoint != 0) goto LAB_0011c60e;
          local_1b0 = 0;
        }
      }
      goto LAB_0011c2ed;
    }
    out_00 = (uchar *)0x0;
  }
  out_01 = (float *)0x0;
LAB_0011c5b2:
  free(local_180.trc[0].lut);
  free(local_180.trc[1].lut);
  free(local_180.trc[2].lut);
  free(out_00);
  free(out_01);
  return uVar2;
}

Assistant:

unsigned convertToXYZ(float* out, float whitepoint[3], const unsigned char* in,
                      unsigned w, unsigned h, const LodePNGState* state) {
  unsigned error = 0;
  size_t i;
  size_t n = w * h;
  const LodePNGColorMode* mode_in = &state->info_raw;
  const LodePNGInfo* info = &state->info_png;
  unsigned char* data = 0;
  float* gammatable = 0;
  int bit16 = mode_in->bitdepth > 8;
  size_t num = bit16 ? 65536 : 256;
  LodePNGColorMode tempmode = lodepng_color_mode_make(LCT_RGBA, bit16 ? 16 : 8);


  unsigned use_icc = 0;
  LodePNGICC icc;
  lodepng_icc_init(&icc);
  if(info->iccp_defined) {
    error = parseICC(&icc, info->iccp_profile, info->iccp_profile_size);
    if(error) goto cleanup; /* corrupted ICC profile */
    use_icc = validateICC(&icc);
  }

  data = (unsigned char*)lodepng_malloc(w * h * (bit16 ? 8 : 4));
  error = lodepng_convert(data, in, &tempmode, mode_in, w, h);
  if(error) goto cleanup;

  /* Handle transfer function */
  {
    float* gammatable_r;
    float* gammatable_g;
    float* gammatable_b;

    /* RGB ICC, can have three different transfer functions */
    if(use_icc && icc.inputspace == 2) {
      gammatable = (float*)lodepng_malloc(num * 3 * sizeof(float));
      gammatable_r = &gammatable[num * 0];
      gammatable_g = &gammatable[num * 1];
      gammatable_b = &gammatable[num * 2];
      convertToXYZ_gamma_table(gammatable_r, num, 0, info, use_icc, &icc);
      convertToXYZ_gamma_table(gammatable_g, num, 1, info, use_icc, &icc);
      convertToXYZ_gamma_table(gammatable_b, num, 2, info, use_icc, &icc);
    } else {
      gammatable = (float*)lodepng_malloc(num * sizeof(float));
      gammatable_r = gammatable_g = gammatable_b = gammatable;
      convertToXYZ_gamma_table(gammatable, num, 0, info, use_icc, &icc);
    }

    if(bit16) {
      for(i = 0; i < n; i++) {
        out[i * 4 + 0] = gammatable_r[data[i * 8 + 0] * 256u + data[i * 8 + 1]];
        out[i * 4 + 1] = gammatable_g[data[i * 8 + 2] * 256u + data[i * 8 + 3]];
        out[i * 4 + 2] = gammatable_b[data[i * 8 + 4] * 256u + data[i * 8 + 5]];
        out[i * 4 + 3] = (data[i * 8 + 6] * 256 + data[i * 8 + 7]) * (1 / 65535.0f);
      }
    } else {
      for(i = 0; i < n; i++) {
        out[i * 4 + 0] = gammatable_r[data[i * 4 + 0]];
        out[i * 4 + 1] = gammatable_g[data[i * 4 + 1]];
        out[i * 4 + 2] = gammatable_b[data[i * 4 + 2]];
        out[i * 4 + 3] = data[i * 4 + 3] * (1 / 255.0f);
      }
    }
  }

  convertToXYZ_chrm(out, w, h, info, use_icc, &icc, whitepoint);

cleanup:
  lodepng_icc_cleanup(&icc);
  lodepng_free(data);
  lodepng_free(gammatable);
  return error;
}